

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDsd.c
# Opt level: O3

void * Ifn_WorkerThread(void *pArg)

{
  int iVar1;
  long lVar2;
  long lVar3;
  Ifn_ThData_t *pThData;
  timespec ts;
  timespec local_40;
  
  while( true ) {
    do {
    } while (*(int *)((long)pArg + 0x26c) == 0);
    if (*(int *)((long)pArg + 0x26c) != 1) break;
    if (*(int *)((long)pArg + 0x260) == -1) {
      pthread_exit((void *)0x0);
    }
    iVar1 = clock_gettime(3,&local_40);
    if (iVar1 < 0) {
      lVar2 = 1;
    }
    else {
      lVar2 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_40.tv_nsec),8);
      lVar2 = ((lVar2 >> 7) - (lVar2 >> 0x3f)) + local_40.tv_sec * -1000000;
    }
    memset((word *)((long)pArg + 0x208),0,(long)*(int *)((long)pArg + 600) << 3);
    iVar1 = Ifn_NtkMatch(*pArg,(word *)((long)pArg + 8),*(int *)((long)pArg + 0x25c),
                         *(int *)((long)pArg + 0x264),0,0,(word *)((long)pArg + 0x208));
    *(int *)((long)pArg + 0x268) = iVar1;
    iVar1 = clock_gettime(3,&local_40);
    if (iVar1 < 0) {
      lVar3 = -1;
    }
    else {
      lVar3 = local_40.tv_nsec / 1000 + local_40.tv_sec * 1000000;
    }
    *(long *)((long)pArg + 0x270) = *(long *)((long)pArg + 0x270) + lVar3 + lVar2;
    *(undefined4 *)((long)pArg + 0x26c) = 0;
  }
  __assert_fail("pThData->Status == 1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/map/if/ifDsd.c"
                ,0xa1a,"void *Ifn_WorkerThread(void *)");
}

Assistant:

void * Ifn_WorkerThread( void * pArg )
{
    Ifn_ThData_t * pThData = (Ifn_ThData_t *)pArg;
    volatile int * pPlace = &pThData->Status;
    abctime clk;
    while ( 1 )
    {
        while ( *pPlace == 0 );
        assert( pThData->Status == 1 );
        if ( pThData->Id == -1 )
        {
            pthread_exit( NULL );
            assert( 0 );
            return NULL;
        }
        clk = Abc_Clock();
        memset( pThData->pConfig, 0, sizeof(word) * pThData->nConfigWords );
        pThData->Result = Ifn_NtkMatch( pThData->pNtk, pThData->pTruth, pThData->nVars, pThData->nConfls, 0, 0, pThData->pConfig );
        pThData->clkUsed += Abc_Clock() - clk;
        pThData->Status = 0;
//        printf( "Finished object %d\n", pThData->Id );
    }
    assert( 0 );
    return NULL;
}